

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mem_manager.cpp
# Opt level: O2

bool __thiscall
SharedMemoryManager::CreateShMem
          (SharedMemoryManager *this,key_t key,size_t size,bool *is_first_created)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  allocator local_c2;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  *is_first_created = false;
  this->sh_mem_key_ = key;
  this->sh_mem_size_ = size;
  iVar2 = shmget(key,size,0x7b6);
  this->sh_mem_id_ = iVar2;
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    if ((iVar2 == 0xd) || (iVar2 == 0x11)) {
      bVar1 = GetShMem(this,key,size);
      return bVar1;
    }
    if (iVar2 == 0x16) {
      std::__cxx11::string::string((string *)&local_80,"shmget error: key [ ",&local_c1);
      std::__cxx11::to_string(&local_a0,key);
      std::operator+(&local_60,&local_80,&local_a0);
      pcVar4 = strerror(*piVar3);
      std::__cxx11::string::string((string *)&local_c0,pcVar4,&local_c2);
      std::operator+(&local_40,&local_60,&local_c0);
    }
    else {
      std::__cxx11::string::string((string *)&local_80,"shmget error: key [ ",&local_c1);
      std::__cxx11::to_string(&local_a0,key);
      std::operator+(&local_60,&local_80,&local_a0);
      pcVar4 = strerror(*piVar3);
      std::__cxx11::string::string((string *)&local_c0,pcVar4,&local_c2);
      std::operator+(&local_40,&local_60,&local_c0);
    }
    std::__cxx11::string::operator=((string *)&this->err_msg_,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    bVar1 = false;
  }
  else {
    *is_first_created = true;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool SharedMemoryManager::CreateShMem(key_t key, size_t size, bool* is_first_created)
{            
    *is_first_created = false;
    sh_mem_key_  = key ;
    sh_mem_size_ = size;
    sh_mem_id_ = shmget((key_t)key, size, IPC_CREAT | IPC_EXCL | 0666 ); //IPC_CREAT | IPC_EXCL 

    if (sh_mem_id_ < 0) {
        if(errno == EINVAL ) {
            err_msg_ = std::string("shmget error: key [ ") + 
                       std::to_string(key) + std::string(strerror(errno)) ;
            DEBUG_ELOG(err_msg_);
        } else if(errno == EEXIST || errno == EACCES ) {
            return GetShMem(key,size);
        } else {
            err_msg_ = std::string("shmget error: key [ ") + 
                       std::to_string(key) + std::string(strerror(errno)) ;
            DEBUG_ELOG(err_msg_);
        }
        return false;
    }
    *is_first_created = true;
    return true;
}